

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tests.cpp
# Opt level: O1

void __thiscall merkle_tests::merkle_test_oneTx_block::test_method(merkle_test_oneTx_block *this)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  undefined1 auVar3 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined1 local_1e9;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  lazy_ostream local_1c8;
  undefined1 *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  CMutableTransaction mtx;
  bool mutated;
  Txid *local_148;
  undefined **local_140;
  uchar local_138;
  undefined1 *local_130;
  Txid **local_128;
  uint256 *local_120;
  undefined1 local_118 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_110;
  undefined1 *local_108;
  uint256 **local_100;
  char *local_f0;
  char *local_e8;
  assertion_result local_e0;
  uint256 root;
  CBlock block;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118;
  block.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  block.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  block.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  block.super_CBlockHeader.nTime = 0;
  block.super_CBlockHeader.nBits = 0;
  block.super_CBlockHeader.nNonce = 0;
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  block.super_CBlockHeader.nVersion = 0;
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  mutated = false;
  block.fChecked = false;
  block.m_checked_witness_commitment = false;
  block.m_checked_merkle_root = false;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::resize(&block.vtx,1);
  CMutableTransaction::CMutableTransaction(&mtx);
  mtx.nLockTime = 0;
  local_118 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),
             (CTransaction **)local_118,(allocator<CTransaction> *)&local_140,&mtx);
  _Var4._M_pi = _Stack_110._M_pi;
  auVar3 = local_118;
  _local_118 = (undefined1  [16])0x0;
  this_00 = ((block.vtx.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  ((block.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)auVar3;
  ((block.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       _Var4._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_110._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_110._M_pi);
  }
  BlockMerkleRoot(&root,&block,&mutated);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp";
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x111;
  file.m_begin = (iterator)&local_198;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a8,msg);
  local_1c8.m_empty = false;
  local_1c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  peVar2 = ((block.vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  auVar8[0] = -((peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
               root.super_base_blob<256U>.m_data._M_elems[0]);
  auVar8[1] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 1)
               == root.super_base_blob<256U>.m_data._M_elems[1]);
  auVar8[2] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 2)
               == root.super_base_blob<256U>.m_data._M_elems[2]);
  auVar8[3] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 3)
               == root.super_base_blob<256U>.m_data._M_elems[3]);
  auVar8[4] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 4)
               == root.super_base_blob<256U>.m_data._M_elems[4]);
  auVar8[5] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 5)
               == root.super_base_blob<256U>.m_data._M_elems[5]);
  auVar8[6] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 6)
               == root.super_base_blob<256U>.m_data._M_elems[6]);
  auVar8[7] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 7)
               == root.super_base_blob<256U>.m_data._M_elems[7]);
  auVar8[8] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
               == root.super_base_blob<256U>.m_data._M_elems[8]);
  auVar8[9] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 9)
               == root.super_base_blob<256U>.m_data._M_elems[9]);
  auVar8[10] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           10) == root.super_base_blob<256U>.m_data._M_elems[10]);
  auVar8[0xb] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                            0xb) == root.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar8[0xc] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                            0xc) == root.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar8[0xd] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                            0xd) == root.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar8[0xe] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                            0xe) == root.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar8[0xf] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                            0xf) == root.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar7[0] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x10) == root.super_base_blob<256U>.m_data._M_elems[0x10]);
  auVar7[1] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x11) == root.super_base_blob<256U>.m_data._M_elems[0x11]);
  auVar7[2] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x12) == root.super_base_blob<256U>.m_data._M_elems[0x12]);
  auVar7[3] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x13) == root.super_base_blob<256U>.m_data._M_elems[0x13]);
  auVar7[4] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x14) == root.super_base_blob<256U>.m_data._M_elems[0x14]);
  auVar7[5] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x15) == root.super_base_blob<256U>.m_data._M_elems[0x15]);
  auVar7[6] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x16) == root.super_base_blob<256U>.m_data._M_elems[0x16]);
  auVar7[7] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x17) == root.super_base_blob<256U>.m_data._M_elems[0x17]);
  auVar7[8] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x18) == root.super_base_blob<256U>.m_data._M_elems[0x18]);
  auVar7[9] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                          0x19) == root.super_base_blob<256U>.m_data._M_elems[0x19]);
  auVar7[10] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                           0x1a) == root.super_base_blob<256U>.m_data._M_elems[0x1a]);
  auVar7[0xb] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                            0x1b) == root.super_base_blob<256U>.m_data._M_elems[0x1b]);
  auVar7[0xc] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                            0x1c) == root.super_base_blob<256U>.m_data._M_elems[0x1c]);
  auVar7[0xd] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                            0x1d) == root.super_base_blob<256U>.m_data._M_elems[0x1d]);
  auVar7[0xe] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                            0x1e) == root.super_base_blob<256U>.m_data._M_elems[0x1e]);
  auVar7[0xf] = -(*(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                            0x1f) == root.super_base_blob<256U>.m_data._M_elems[0x1f]);
  auVar7 = auVar7 & auVar8;
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff);
  local_148 = &peVar2->hash;
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp";
  local_e8 = "";
  _Stack_110._M_pi._0_1_ = 0;
  local_118 = (undefined1  [8])&PTR__lazy_ostream_013d4988;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_138 = '\0';
  local_140 = &PTR__lazy_ostream_013d4808;
  local_130 = boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_128 = &local_148;
  local_120 = &root;
  local_100 = &local_120;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_1c8,1,2,REQUIRE,0xfe908c,(size_t)&local_f0,0x111,local_118,
             "block.vtx[0]->GetHash()",&local_140);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp";
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x112;
  file_00.m_begin = (iterator)&local_1d8;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1e8,
             msg_00);
  local_120 = (uint256 *)&mutated;
  local_1c8.m_empty = false;
  local_1c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_1b0 = "";
  local_148 = (Txid *)&local_1e9;
  local_1e9 = '\0';
  local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(mutated ^ 1);
  local_e0.m_message.px = (element_type *)0x0;
  local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp";
  local_e8 = "";
  _Stack_110._M_pi._0_1_ = 0;
  local_118 = (undefined1  [8])&PTR__lazy_ostream_013d4010;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_138 = '\0';
  local_140 = &PTR__lazy_ostream_013d4010;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  local_100 = &local_120;
  boost::test_tools::tt_detail::report_assertion
            (&local_e0,&local_1c8,1,2,REQUIRE,0xe8e7e6,(size_t)&local_f0,0x112,local_118,"false",
             &local_140);
  boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&mtx.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&mtx.vin);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block.vtx);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_test_oneTx_block)
{
    bool mutated = false;
    CBlock block;

    block.vtx.resize(1);
    CMutableTransaction mtx;
    mtx.nLockTime = 0;
    block.vtx[0] = MakeTransactionRef(std::move(mtx));
    uint256 root = BlockMerkleRoot(block, &mutated);
    BOOST_CHECK_EQUAL(root, block.vtx[0]->GetHash());
    BOOST_CHECK_EQUAL(mutated, false);
}